

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O2

void DoTransform(uint32_t bits,int16_t *src,uint8_t *dst)

{
  (*(code *)(&DAT_001a9d44 + *(int *)(&DAT_001a9d44 + (ulong)(bits >> 0x1e) * 4)))();
  return;
}

Assistant:

static WEBP_INLINE void DoTransform(uint32_t bits, const int16_t* const src,
                                    uint8_t* const dst) {
  switch (bits >> 30) {
    case 3:
      VP8Transform(src, dst, 0);
      break;
    case 2:
      VP8TransformAC3(src, dst);
      break;
    case 1:
      VP8TransformDC(src, dst);
      break;
    default:
      break;
  }
}